

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

parser_error parse_monster_category(parser *p)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  char *pcVar3;
  ui_monster_category *c;
  ui_knowledge_parse_state *s;
  parser *p_local;
  
  puVar1 = (undefined8 *)parser_priv(p);
  if (puVar1 != (undefined8 *)0x0) {
    puVar2 = (undefined8 *)mem_zalloc(0x30);
    *puVar2 = *puVar1;
    pcVar3 = parser_getstr(p,"name");
    pcVar3 = string_make(pcVar3);
    puVar2[1] = pcVar3;
    *puVar1 = puVar2;
    return PARSE_ERROR_NONE;
  }
  __assert_fail("s",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-knowledge.c"
                ,0xc9e,"enum parser_error parse_monster_category(struct parser *)");
}

Assistant:

static enum parser_error parse_monster_category(struct parser *p)
{
	struct ui_knowledge_parse_state *s =
		(struct ui_knowledge_parse_state*) parser_priv(p);
	struct ui_monster_category *c;

	assert(s);
	c = mem_zalloc(sizeof(*c));
	c->next = s->categories;
	c->name = string_make(parser_getstr(p, "name"));
	s->categories = c;
	return PARSE_ERROR_NONE;
}